

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

int internal_device_stop(AMQP_DEVICE_INSTANCE_conflict *instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  DEVICE_STATE new_state;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  if ((instance->msgr_state & ~TELEMETRY_MESSENGER_STATE_STARTED) ==
      TELEMETRY_MESSENGER_STATE_STOPPING) {
LAB_00130160:
    if ((instance->twin_msgr_state & ~TWIN_MESSENGER_STATE_STARTED) != TWIN_MESSENGER_STATE_STOPPING
       ) {
      iVar1 = twin_messenger_stop(instance->twin_messenger_handle);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        iVar4 = 0x344;
        new_state = DEVICE_STATE_ERROR_MSG;
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0013022c;
        pcVar5 = instance->config->device_id;
        pcVar3 = "Failed stopping device \'%s\' (twin_messenger_stop failed)";
        iVar1 = 0x342;
        goto LAB_00130227;
      }
    }
    new_state = DEVICE_STATE_STOPPED;
    if ((instance->config->authentication_mode != DEVICE_AUTH_MODE_CBS) ||
       (instance->auth_state == AUTHENTICATION_STATE_STOPPED)) {
      iVar4 = 0;
      goto LAB_0013022c;
    }
    iVar1 = authentication_stop(instance->authentication_handle);
    iVar4 = 0;
    if (iVar1 == 0) goto LAB_0013022c;
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x34c;
    new_state = DEVICE_STATE_ERROR_AUTH;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0013022c;
    pcVar5 = instance->config->device_id;
    pcVar3 = "Failed stopping device \'%s\' (authentication_stop failed)";
    iVar1 = 0x34a;
  }
  else {
    iVar1 = telemetry_messenger_stop(instance->messenger_handle);
    if (iVar1 == 0) goto LAB_00130160;
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x33c;
    new_state = DEVICE_STATE_ERROR_MSG;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0013022c;
    pcVar5 = instance->config->device_id;
    pcVar3 = "Failed stopping device \'%s\' (telemetry_messenger_stop failed)";
    iVar1 = 0x33a;
  }
LAB_00130227:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
            ,"internal_device_stop",iVar1,1,pcVar3,pcVar5);
LAB_0013022c:
  update_state(instance,new_state);
  return iVar4;
}

Assistant:

static int internal_device_stop(AMQP_DEVICE_INSTANCE* instance)
{
    int result;

    if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPED &&
        instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPING &&
        telemetry_messenger_stop(instance->messenger_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (telemetry_messenger_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_MSG);
        result = MU_FAILURE;
    }
    else if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPED &&
        instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPING &&
        twin_messenger_stop(instance->twin_messenger_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (twin_messenger_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_MSG);
        result = MU_FAILURE;
    }
    else if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS &&
        instance->auth_state != AUTHENTICATION_STATE_STOPPED &&
        authentication_stop(instance->authentication_handle) != RESULT_OK)
    {
        LogError("Failed stopping device '%s' (authentication_stop failed)", instance->config->device_id);
        update_state(instance, DEVICE_STATE_ERROR_AUTH);
        result = MU_FAILURE;
    }
    else
    {
        update_state(instance, DEVICE_STATE_STOPPED);
        result = RESULT_OK;
    }

    return result;
}